

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneralMatrixMatrixTriangular.h
# Opt level: O1

void Eigen::internal::
     general_matrix_matrix_triangular_product<long,_double,_0,_false,_double,_1,_false,_0,_1,_0>::
     run(long size,long depth,double *_lhs,long lhsStride,double *_rhs,long rhsStride,ResScalar *res
        ,long resStride,ResScalar *alpha)

{
  double *pdVar1;
  ResScalar alpha_00;
  double *blockA;
  double *pdVar2;
  undefined8 *puVar3;
  ulong uVar4;
  ulong __size;
  long lVar5;
  double *pdVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double dStack_b8;
  long local_b0;
  long nc;
  long local_a0;
  double *local_98;
  long local_90;
  double *local_88;
  long local_80;
  long local_78;
  ulong local_70;
  long local_68;
  long kc;
  ulong local_58;
  ulong local_50;
  long mc;
  double *local_40;
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> local_34;
  gemm_pack_rhs<double,_long,_4,_1,_false,_false> local_33;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> local_32;
  tribb_kernel<double,_double,_long,_4,_4,_false,_false,_1> local_31 [5];
  gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false> pack_lhs;
  gemm_pack_rhs<double,_long,_4,_1,_false,_false> pack_rhs;
  gebp_kernel<double,_double,_long,_4,_4,_false,_false> gebp;
  tribb_kernel<double,_double,_long,_4,_4,_false,_false,_1> sybb;
  
  pdVar2 = &dStack_b8;
  local_b0 = size;
  local_a0 = rhsStride;
  local_98 = _rhs;
  local_88 = _lhs;
  local_80 = lhsStride;
  local_68 = depth;
  kc = size;
  local_50 = size;
  computeProductBlockingSizes<double,double,1,long>(&local_68,(long *)&local_50,&local_b0);
  lVar5 = local_68;
  if (4 < (long)local_50) {
    local_50 = local_50 & 0x7ffffffffffffffc;
  }
  if (local_50 * local_68 >> 0x3d != 0) {
LAB_0010cce3:
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = operator_delete;
    __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  __size = local_50 * local_68 * 8;
  if (__size < 0x20001) {
    local_40 = (double *)((long)&dStack_b8 - (__size + 0xf & 0xfffffffffffffff0));
    pdVar2 = local_40;
  }
  else {
    local_40 = (double *)malloc(__size);
    if (local_40 == (double *)0x0) goto LAB_0010cce3;
  }
  uVar4 = (kc + 8) * lVar5;
  if (0x1fffffffffffffff < uVar4) {
    pdVar2[-1] = 5.439618294804e-318;
    puVar3 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar3 = operator_delete;
    pdVar2[-1] = 5.4397961584365e-318;
    __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  local_58 = __size;
  local_70 = uVar4;
  if (uVar4 < 0x4001) {
    pdVar2 = (double *)((long)pdVar2 - (uVar4 * 8 + 0xf & 0xfffffffffffffff0));
    mc = (long)pdVar2;
  }
  else {
    pdVar2[-1] = 5.43722701707813e-318;
    mc = (long)malloc(uVar4 * 8);
    if ((void *)mc == (void *)0x0) {
      pdVar2[-1] = 5.44007283519817e-318;
      puVar3 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar3 = operator_delete;
      pdVar2[-1] = (double)&LAB_0010cd3f;
      __cxa_throw(puVar3,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
  }
  if (0 < depth) {
    pdVar6 = (double *)(lVar5 * 0x40 + mc);
    lVar8 = 0;
    local_90 = depth;
    lVar5 = kc;
    do {
      lVar7 = local_a0;
      lVar9 = local_68 + lVar8;
      if (local_90 <= local_68 + lVar8) {
        lVar9 = local_90;
      }
      lVar9 = lVar9 - lVar8;
      local_78 = lVar8;
      pdVar1 = local_98 + lVar8 * local_a0;
      *(undefined8 *)((long)pdVar2 + -0x10) = 0;
      *(undefined8 *)((long)pdVar2 + -8) = 0;
      *(undefined8 *)((long)pdVar2 + -0x18) = 0x10cb4e;
      gemm_pack_rhs<double,_long,_4,_1,_false,_false>::operator()
                (&local_33,pdVar6,pdVar1,lVar7,lVar9,lVar5,*(long *)((long)pdVar2 + -0x10),
                 *(long *)((long)pdVar2 + -8));
      if (0 < lVar5) {
        nc = (long)(local_88 + local_78 * local_80);
        lVar8 = 0;
        do {
          lVar7 = local_50 + lVar8;
          if (lVar5 <= (long)(local_50 + lVar8)) {
            lVar7 = lVar5;
          }
          lVar7 = lVar7 - lVar8;
          pdVar1 = (double *)(nc + lVar8 * 8);
          *(undefined8 *)((long)pdVar2 + -0x10) = 0;
          *(undefined8 *)((long)pdVar2 + -8) = 0;
          blockA = local_40;
          lVar5 = local_80;
          *(undefined8 *)((long)pdVar2 + -0x18) = 0x10cbb7;
          gemm_pack_lhs<double,_long,_4,_2,_0,_false,_false>::operator()
                    (&local_34,blockA,pdVar1,lVar5,lVar9,lVar7,*(long *)((long)pdVar2 + -0x10),
                     *(long *)((long)pdVar2 + -8));
          alpha_00 = *alpha;
          *(long *)((long)pdVar2 + -0x10) = mc;
          *(undefined8 *)((long)pdVar2 + -0x20) = 0;
          *(undefined8 *)((long)pdVar2 + -0x18) = 0;
          *(undefined8 *)((long)pdVar2 + -0x28) = 0xffffffffffffffff;
          *(undefined8 *)((long)pdVar2 + -0x30) = 0xffffffffffffffff;
          *(long *)((long)pdVar2 + -0x38) = lVar8;
          *(long *)((long)pdVar2 + -0x40) = lVar9;
          *(undefined8 *)((long)pdVar2 + -0x48) = 0x10cc10;
          gebp_kernel<double,_double,_long,_4,_4,_false,_false>::operator()
                    (&local_32,res + lVar8,resStride,blockA,pdVar6,lVar7,
                     *(long *)((long)pdVar2 + -0x40),*(long *)((long)pdVar2 + -0x38),alpha_00,
                     *(long *)((long)pdVar2 + -0x30),*(long *)((long)pdVar2 + -0x28),
                     *(long *)((long)pdVar2 + -0x20),*(long *)((long)pdVar2 + -0x18),
                     *(double **)((long)pdVar2 + -0x10));
          *(long *)((long)pdVar2 + -0x10) = mc;
          *(ResScalar **)((long)pdVar2 + -0x18) = alpha;
          *(long *)((long)pdVar2 + -0x20) = lVar9;
          *(undefined8 *)((long)pdVar2 + -0x28) = 0x10cc51;
          tribb_kernel<double,_double,_long,_4,_4,_false,_false,_1>::operator()
                    (local_31,res + lVar8 * resStride + lVar8,resStride,blockA,
                     pdVar6 + lVar8 * lVar9,lVar7,*(long *)((long)pdVar2 + -0x20),
                     *(ResScalar **)((long)pdVar2 + -0x18),*(double **)((long)pdVar2 + -0x10));
          lVar8 = lVar8 + local_50;
          lVar5 = kc;
        } while (lVar8 < kc);
      }
      lVar8 = local_78 + local_68;
    } while (lVar8 < local_90);
  }
  lVar5 = mc;
  if (0x4000 < local_70) {
    *(undefined8 *)((long)pdVar2 + -8) = 0x10cc91;
    free((void *)lVar5);
  }
  pdVar6 = local_40;
  if (0x20000 < local_58) {
    *(undefined8 *)((long)pdVar2 + -8) = 0x10cca4;
    free(pdVar6);
  }
  return;
}

Assistant:

static EIGEN_STRONG_INLINE void run(Index size, Index depth,const LhsScalar* _lhs, Index lhsStride,
                                      const RhsScalar* _rhs, Index rhsStride, ResScalar* res, Index resStride, const ResScalar& alpha)
  {
    const_blas_data_mapper<LhsScalar, Index, LhsStorageOrder> lhs(_lhs,lhsStride);
    const_blas_data_mapper<RhsScalar, Index, RhsStorageOrder> rhs(_rhs,rhsStride);

    typedef gebp_traits<LhsScalar,RhsScalar> Traits;

    Index kc = depth; // cache block size along the K direction
    Index mc = size;  // cache block size along the M direction
    Index nc = size;  // cache block size along the N direction
    computeProductBlockingSizes<LhsScalar,RhsScalar>(kc, mc, nc);
    // !!! mc must be a multiple of nr:
    if(mc > Traits::nr)
      mc = (mc/Traits::nr)*Traits::nr;

    std::size_t sizeW = kc*Traits::WorkSpaceFactor;
    std::size_t sizeB = sizeW + kc*size;
    ei_declare_aligned_stack_constructed_variable(LhsScalar, blockA, kc*mc, 0);
    ei_declare_aligned_stack_constructed_variable(RhsScalar, allocatedBlockB, sizeB, 0);
    RhsScalar* blockB = allocatedBlockB + sizeW;
    
    gemm_pack_lhs<LhsScalar, Index, Traits::mr, Traits::LhsProgress, LhsStorageOrder> pack_lhs;
    gemm_pack_rhs<RhsScalar, Index, Traits::nr, RhsStorageOrder> pack_rhs;
    gebp_kernel <LhsScalar, RhsScalar, Index, Traits::mr, Traits::nr, ConjugateLhs, ConjugateRhs> gebp;
    tribb_kernel<LhsScalar, RhsScalar, Index, Traits::mr, Traits::nr, ConjugateLhs, ConjugateRhs, UpLo> sybb;

    for(Index k2=0; k2<depth; k2+=kc)
    {
      const Index actual_kc = (std::min)(k2+kc,depth)-k2;

      // note that the actual rhs is the transpose/adjoint of mat
      pack_rhs(blockB, &rhs(k2,0), rhsStride, actual_kc, size);

      for(Index i2=0; i2<size; i2+=mc)
      {
        const Index actual_mc = (std::min)(i2+mc,size)-i2;

        pack_lhs(blockA, &lhs(i2, k2), lhsStride, actual_kc, actual_mc);

        // the selected actual_mc * size panel of res is split into three different part:
        //  1 - before the diagonal => processed with gebp or skipped
        //  2 - the actual_mc x actual_mc symmetric block => processed with a special kernel
        //  3 - after the diagonal => processed with gebp or skipped
        if (UpLo==Lower)
          gebp(res+i2, resStride, blockA, blockB, actual_mc, actual_kc, (std::min)(size,i2), alpha,
               -1, -1, 0, 0, allocatedBlockB);

        sybb(res+resStride*i2 + i2, resStride, blockA, blockB + actual_kc*i2, actual_mc, actual_kc, alpha, allocatedBlockB);

        if (UpLo==Upper)
        {
          Index j2 = i2+actual_mc;
          gebp(res+resStride*j2+i2, resStride, blockA, blockB+actual_kc*j2, actual_mc, actual_kc, (std::max)(Index(0), size-j2), alpha,
               -1, -1, 0, 0, allocatedBlockB);
        }
      }
    }
  }